

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O3

int __thiscall
TPZMatrix<std::complex<long_double>_>::AddSub
          (TPZMatrix<std::complex<long_double>_> *this,int64_t sRow,int64_t sCol,int64_t rowSize,
          int64_t colSize,int64_t pRow,int64_t pCol,TPZMatrix<std::complex<long_double>_> *pA)

{
  long lVar1;
  int64_t iVar2;
  int64_t iVar3;
  longdouble lVar4;
  longdouble lVar5;
  complex<long_double> __r;
  undefined4 local_98;
  undefined4 uStack_94;
  undefined2 uStack_90;
  undefined2 uStack_8e;
  undefined4 uStack_8c;
  undefined4 local_88;
  undefined4 uStack_84;
  undefined2 uStack_80;
  undefined2 uStack_7e;
  undefined4 uStack_7c;
  longdouble local_78;
  longdouble local_68;
  undefined4 local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  
  lVar1 = rowSize + pRow;
  if (((pA->super_TPZBaseMatrix).fRow < lVar1) || ((pA->super_TPZBaseMatrix).fCol < pCol + colSize))
  {
    Error("AddSub <the sub-matrix is too big that target>",(char *)0x0);
  }
  if (0 < rowSize) {
    do {
      iVar2 = pCol;
      iVar3 = sCol;
      if (0 < colSize) {
        do {
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                    (&local_58,this,sRow,iVar3);
          (*(pA->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                    (&local_78,pA,pRow,iVar2);
          uStack_90 = (undefined2)uStack_50;
          uStack_8e = (undefined2)((uint)uStack_50 >> 0x10);
          uStack_8c = uStack_4c;
          uStack_80 = (undefined2)uStack_40;
          uStack_7e = (undefined2)((uint)uStack_40 >> 0x10);
          uStack_7c = uStack_3c;
          lVar5 = (longdouble)CONCAT28(uStack_90,CONCAT44(uStack_54,local_58)) + local_78;
          lVar4 = (longdouble)CONCAT28(uStack_80,CONCAT44(uStack_44,local_48)) + local_68;
          local_98 = SUB104(lVar5,0);
          uStack_94 = (undefined4)((unkuint10)lVar5 >> 0x20);
          uStack_90 = (undefined2)((unkuint10)lVar5 >> 0x40);
          local_88 = SUB104(lVar4,0);
          uStack_84 = (undefined4)((unkuint10)lVar4 >> 0x20);
          uStack_80 = (undefined2)((unkuint10)lVar4 >> 0x40);
          (*(pA->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                    (pA,pRow,iVar2,&local_98);
          iVar2 = iVar2 + 1;
          iVar3 = iVar3 + 1;
        } while (iVar2 < pCol + colSize);
      }
      pRow = pRow + 1;
      sRow = sRow + 1;
    } while (pRow < lVar1);
  }
  return 1;
}

Assistant:

int TPZMatrix<TVar>::AddSub(const int64_t sRow, const int64_t sCol, const int64_t rowSize,
							const int64_t colSize,const int64_t pRow,const int64_t pCol, TPZMatrix<TVar> *pA ) const {
    if ( ((pRow + rowSize) > pA->Rows()) || ((pCol + colSize) > pA->Cols())) {
        Error( "AddSub <the sub-matrix is too big that target>" );
    }
    int64_t NewRowSize = rowSize+pRow;
    int64_t NewColSize = colSize+pCol;
	
    int64_t row = sRow;
    for ( int64_t r = pRow; r < NewRowSize; r++, row++ ) {
        int64_t col = sCol;
        for ( int64_t c = pCol ; c < NewColSize; c++, col++ ) {
            pA->PutVal( r, c, GetVal( row, col )+pA->GetVal(r,c));
        }
    }
    return( 1 );
}